

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bss_section.cpp
# Opt level: O3

void __thiscall
BssSection_RoundTripForAnEmptySection_Test::~BssSection_RoundTripForAnEmptySection_Test
          (BssSection_RoundTripForAnEmptySection_Test *this)

{
  (this->super_BssSection).super_Test._vptr_Test = (_func_int **)&PTR__BssSection_00233970;
  pstore::database::~database(&(this->super_BssSection).import_db_);
  in_memory_store::~in_memory_store(&(this->super_BssSection).import_store_);
  pstore::database::~database(&(this->super_BssSection).export_db_);
  in_memory_store::~in_memory_store(&(this->super_BssSection).export_store_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x290);
  return;
}

Assistant:

TEST_F (BssSection, RoundTripForAnEmptySection) {
    constexpr auto kind = pstore::repo::section_kind::bss;
    // The type used to store a text section's properties.
    using section_type = pstore::repo::enum_to_section_t<kind>;
    static_assert (std::is_same<section_type, pstore::repo::bss_section>::value,
                   "Expected bss to map to bss_section");

    pstore::exchange::export_ns::string_mapping exported_names{
        export_db_, pstore::exchange::export_ns::name_index_tag ()};
    pstore::repo::section_content exported_content{kind};
    std::string const exported_json =
        export_section<kind> (export_db_, exported_names, exported_content, false);



    std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher>> dispatchers;
    auto inserter = std::back_inserter (dispatchers);

    pstore::exchange::import_ns::string_mapping imported_names;
    pstore::repo::section_content imported_content;

    // Find the rule that is used to import sections represented by an instance of section_type.
    using section_importer =
        pstore::exchange::import_ns::section_to_importer_t<section_type, decltype (inserter)>;
    auto parser = make_json_object_parser<section_importer> (&import_db_, kind, &imported_names,
                                                             &imported_content, &inserter);
    parser.input (exported_json).eof ();
    ASSERT_FALSE (parser.has_error ()) << "JSON error was: " << parser.last_error ().message ()
                                       << ' ' << parser.coordinate () << '\n'
                                       << exported_json;

    ASSERT_EQ (dispatchers.size (), 1U)
        << "Expected a single creation dispatcher to be added to the dispatchers container";
    EXPECT_EQ (dispatchers.front ()->kind (), kind)
        << "The creation dispatcher should be able to create a text section";

    EXPECT_EQ (exported_content, imported_content);
}